

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS DetectNewType(char *JsonString,size_t JsonStringLength,size_t StringIndex,_Bool IsJson5,
                       size_t *pNewStringIndex,JL_DATA_TYPE *pNewType,size_t *pErrorAtPos)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  JL_DATA_TYPE local_4c;
  char nextNextChar;
  char nextChar;
  char currentChar;
  size_t sStack_48;
  JL_DATA_TYPE newType;
  size_t i;
  _Bool inMultiLineComment;
  _Bool inSingleLineComment;
  JL_STATUS jlStatus;
  JL_DATA_TYPE *pNewType_local;
  size_t *pNewStringIndex_local;
  _Bool IsJson5_local;
  size_t StringIndex_local;
  size_t JsonStringLength_local;
  char *JsonString_local;
  
  bVar4 = false;
  bVar5 = false;
  *pNewStringIndex = StringIndex;
  *pNewType = JL_DATA_TYPE_NONE;
  i._4_4_ = JL_STATUS_END_OF_DATA;
  sStack_48 = StringIndex;
  do {
    if (JsonStringLength <= sStack_48) {
      return JL_STATUS_END_OF_DATA;
    }
    local_4c = JL_DATA_TYPE_NONE;
    cVar1 = JsonString[sStack_48];
    cVar2 = JsonString[sStack_48 + 1];
    if (cVar2 == '\0') {
      cVar3 = '\0';
    }
    else {
      cVar3 = JsonString[sStack_48 + 2];
    }
    if ((bVar4) && (cVar1 == '\n')) {
      bVar4 = false;
    }
    else if ((bVar5) && ((cVar1 == '*' && (cVar2 == '/')))) {
      bVar5 = false;
      sStack_48 = sStack_48 + 1;
    }
    else if (((!bVar4) && (((!bVar5 && (cVar1 != ' ')) && (cVar1 != '\n')))) &&
            ((((cVar1 != '\r' && (cVar1 != '\t')) && ((cVar1 != '\f' || (!IsJson5)))) &&
             ((cVar1 != '\v' || (!IsJson5)))))) {
      if ((IsJson5) && ((cVar1 == -0x3e && (cVar2 == -0x60)))) {
        sStack_48 = sStack_48 + 1;
      }
      else if ((IsJson5) &&
              (((((cVar1 == -0x1e && (cVar2 == -0x80)) && (cVar3 == -0x58)) ||
                (((cVar1 == -0x1e && (cVar2 == -0x80)) && (cVar3 == -0x57)))) ||
               (((cVar1 == -0x11 && (cVar2 == -0x45)) && (cVar3 == -0x41)))))) {
        sStack_48 = sStack_48 + 2;
      }
      else {
        if (cVar1 == '{') {
          local_4c = JL_DATA_TYPE_DICTIONARY;
LAB_00105abd:
          if (local_4c == JL_DATA_TYPE_NONE) {
            return i._4_4_;
          }
          *pNewStringIndex = sStack_48;
          *pNewType = local_4c;
          return JL_STATUS_SUCCESS;
        }
        if (cVar1 == '[') {
          local_4c = JL_DATA_TYPE_LIST;
          goto LAB_00105abd;
        }
        if (cVar1 == '\"') {
          local_4c = JL_DATA_TYPE_STRING;
          goto LAB_00105abd;
        }
        if ((IsJson5) && (cVar1 == '\'')) {
          local_4c = JL_DATA_TYPE_STRING;
          goto LAB_00105abd;
        }
        if ((cVar1 == 'f') || (cVar1 == 't')) {
          local_4c = JL_DATA_TYPE_BOOL;
          goto LAB_00105abd;
        }
        if ((((('/' < cVar1) && (cVar1 < ':')) || (cVar1 == '-')) || ((cVar1 == '.' && (IsJson5))))
           || ((cVar1 == '+' && (IsJson5)))) {
          local_4c = JL_DATA_TYPE_NUMBER;
          goto LAB_00105abd;
        }
        if ((IsJson5) &&
           ((((cVar1 == 'i' || (cVar1 == 'I')) && ((cVar2 == 'n' || (cVar2 == 'N')))) ||
            (((cVar1 == 'n' || (cVar1 == 'N')) && ((cVar2 == 'a' || (cVar2 == 'A')))))))) {
          local_4c = JL_DATA_TYPE_NUMBER;
          goto LAB_00105abd;
        }
        if (cVar1 == 'n') {
          local_4c = JL_DATA_TYPE_STRING;
          goto LAB_00105abd;
        }
        if (((IsJson5) && (cVar1 == '/')) && (cVar2 == '/')) {
          sStack_48 = sStack_48 + 1;
          bVar4 = true;
        }
        else {
          if (((!IsJson5) || (cVar1 != '/')) || (cVar2 != '*')) {
            i._4_4_ = JL_STATUS_INVALID_DATA;
            if (pErrorAtPos != (size_t *)0x0) {
              *pErrorAtPos = sStack_48;
            }
            goto LAB_00105abd;
          }
          sStack_48 = sStack_48 + 1;
          bVar5 = true;
        }
      }
    }
    sStack_48 = sStack_48 + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    DetectNewType
    (
        char const*     JsonString,
        size_t          JsonStringLength,
        size_t          StringIndex,
        bool            IsJson5,
        size_t*         pNewStringIndex,
        JL_DATA_TYPE*   pNewType,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    *pNewStringIndex = StringIndex;
    *pNewType = JL_DATA_TYPE_NONE;

    jlStatus = JL_STATUS_END_OF_DATA;
    for( size_t i=StringIndex; i<JsonStringLength; i++ )
    {
        JL_DATA_TYPE newType = JL_DATA_TYPE_NONE;
        char currentChar = JsonString[i];
        char nextChar = JsonString[i+1];
        char nextNextChar = 0 != nextChar ? JsonString[i+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
            continue;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            i += 1; // Skip the second character in end of comment marker
            continue;
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            continue;
        }

        if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\f' == currentChar && IsJson5 )
            ||  ( '\v' == currentChar && IsJson5 ) )
        {
            // Whitespace
            continue;
        }
        else if( IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            i += 1;
            continue;
        }
        else if(    IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            i += 2;
            continue;
        }

        if( '{' == currentChar )
        {
            newType = JL_DATA_TYPE_DICTIONARY;
        }
        else if( '[' == currentChar )
        {
            newType = JL_DATA_TYPE_LIST;
        }
        else if( '\"' == currentChar )
        {
            newType = JL_DATA_TYPE_STRING;
        }
        else if( IsJson5 && '\'' == currentChar )
        {
            newType = JL_DATA_TYPE_STRING;
        }
        else if(    'f' == currentChar
                 || 't' == currentChar )
        {
            newType = JL_DATA_TYPE_BOOL;
        }
        else if(    ( currentChar >= '0' && currentChar <= '9' )
                 || '-' == currentChar
                 || ( '.' == currentChar && IsJson5 )
                 || ( '+' == currentChar && IsJson5 )
                 )
        {
            newType = JL_DATA_TYPE_NUMBER;
        }
        else if(    IsJson5
                 && (
                        ( ( 'i' == currentChar || 'I' == currentChar ) && ( 'n' == nextChar || 'N' == nextChar ) )
                     || ( ( 'n' == currentChar || 'N' == currentChar ) && ( 'a' == nextChar || 'A' == nextChar ) ) ) )
        {
            // Allow for "inf" or "nan" for json5
            newType = JL_DATA_TYPE_NUMBER;
        }
        else if( 'n' == currentChar )
        {
            // If NULL type then we will just treat as a string as we have NULL strings. tyle
            newType = JL_DATA_TYPE_STRING;
        }
        else if( IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            // Single line comment
            i += 1; // Skip the second character in comment marker
            inSingleLineComment = true;
            continue;
        }
        else if( IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            // Multi line comment
            i += 1; // Skip the second character in comment marker
            inMultiLineComment = true;
            continue;
        }
        else
        {
            // Unexpected character at this time.
            jlStatus = JL_STATUS_INVALID_DATA;
            if( NULL != pErrorAtPos )
            {
                *pErrorAtPos = i;
            }
        }

        if( JL_DATA_TYPE_NONE != newType )
        {
            *pNewStringIndex = i;
            *pNewType = newType;
            jlStatus = JL_STATUS_SUCCESS;
        }

        break;
    }

    return jlStatus;
}